

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.cc
# Opt level: O0

ostream * absl::lts_20240722::time_internal::cctz::detail::operator<<(ostream *os,weekday wd)

{
  weekday wd_local;
  ostream *os_local;
  
  os_local = os;
  switch(wd) {
  case monday:
    os_local = std::operator<<(os,"Monday");
    break;
  case tuesday:
    os_local = std::operator<<(os,"Tuesday");
    break;
  case wednesday:
    os_local = std::operator<<(os,"Wednesday");
    break;
  case thursday:
    os_local = std::operator<<(os,"Thursday");
    break;
  case friday:
    os_local = std::operator<<(os,"Friday");
    break;
  case saturday:
    os_local = std::operator<<(os,"Saturday");
    break;
  case sunday:
    os_local = std::operator<<(os,"Sunday");
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, weekday wd) {
  switch (wd) {
    case weekday::monday:
      return os << "Monday";
    case weekday::tuesday:
      return os << "Tuesday";
    case weekday::wednesday:
      return os << "Wednesday";
    case weekday::thursday:
      return os << "Thursday";
    case weekday::friday:
      return os << "Friday";
    case weekday::saturday:
      return os << "Saturday";
    case weekday::sunday:
      return os << "Sunday";
  }
  return os;  // Should never get here, but -Wreturn-type may warn without this.
}